

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::setTransformOriginPoint(QGraphicsItem *this,QPointF *origin)

{
  double dVar1;
  QGraphicsItemPrivate *pQVar2;
  TransformData *pTVar3;
  long *in_RDI;
  long in_FS_OFFSET;
  qreal qVar4;
  QPointF newOrigin;
  QVariant newOriginVariant;
  TransformData *in_stack_ffffffffffffff20;
  QPointF *in_stack_ffffffffffffff28;
  QGraphicsItem *in_stack_ffffffffffffff68;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  prepareGeometryChange(in_stack_ffffffffffffff68);
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RDI + 1));
  if ((*(ulong *)&pQVar2->field_0x160 & 0x80000000000) != 0) {
    local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::fromValue<QPointF>(in_stack_ffffffffffffff28);
    (**(code **)(*in_RDI + 0x108))(&local_28,in_RDI,0x20,&local_48);
    ::QVariant::~QVariant(&local_48);
    ::QVariant::toPointF();
    ::QVariant::~QVariant((QVariant *)&local_28);
  }
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RDI + 1));
  if (pQVar2->transformData == (TransformData *)0x0) {
    pTVar3 = (TransformData *)operator_new(0x90);
    QGraphicsItemPrivate::TransformData::TransformData(in_stack_ffffffffffffff20);
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    pQVar2->transformData = pTVar3;
  }
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RDI + 1));
  dVar1 = pQVar2->transformData->xOrigin;
  qVar4 = QPointF::x((QPointF *)&stack0xffffffffffffff68);
  if ((dVar1 == qVar4) && (!NAN(dVar1) && !NAN(qVar4))) {
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 1));
    in_stack_ffffffffffffff28 = (QPointF *)pQVar2->transformData->yOrigin;
    qVar4 = QPointF::y((QPointF *)&stack0xffffffffffffff68);
    if (((double)in_stack_ffffffffffffff28 == qVar4) &&
       (!NAN((double)in_stack_ffffffffffffff28) && !NAN(qVar4))) goto LAB_0097f168;
  }
  qVar4 = QPointF::x((QPointF *)&stack0xffffffffffffff68);
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RDI + 1));
  pQVar2->transformData->xOrigin = qVar4;
  qVar4 = QPointF::y((QPointF *)&stack0xffffffffffffff68);
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RDI + 1));
  pQVar2->transformData->yOrigin = qVar4;
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RDI + 1));
  pQVar2->transformData->onlyTransform = false;
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RDI + 1));
  *(ulong *)&pQVar2->field_0x160 =
       *(ulong *)&pQVar2->field_0x160 & 0xffdfffffffffffff | 0x20000000000000;
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RDI + 1));
  if ((*(ulong *)&pQVar2->field_0x160 & 0x80000000000) != 0) {
    ::QVariant::fromValue<QPointF>(in_stack_ffffffffffffff28);
    (**(code **)(*in_RDI + 0x108))(&local_68,in_RDI,0x21,&local_88);
    ::QVariant::~QVariant(&local_68);
    ::QVariant::~QVariant(&local_88);
  }
LAB_0097f168:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::setTransformOriginPoint(const QPointF &origin)
{
    prepareGeometryChange();
    QPointF newOrigin = origin;

    if (d_ptr->flags & ItemSendsGeometryChanges) {
        // Notify the item that the origin point is changing.
        const QVariant newOriginVariant(itemChange(ItemTransformOriginPointChange,
                                                   QVariant::fromValue<QPointF>(origin)));
        newOrigin = newOriginVariant.toPointF();
    }

    if (!d_ptr->transformData)
        d_ptr->transformData = new QGraphicsItemPrivate::TransformData;

    if (d_ptr->transformData->xOrigin == newOrigin.x()
        && d_ptr->transformData->yOrigin == newOrigin.y()) {
        return;
    }

    d_ptr->transformData->xOrigin = newOrigin.x();
    d_ptr->transformData->yOrigin = newOrigin.y();
    d_ptr->transformData->onlyTransform = false;
    d_ptr->dirtySceneTransform = 1;

    // Send post-notification.
    if (d_ptr->flags & ItemSendsGeometryChanges)
        itemChange(ItemTransformOriginPointHasChanged, QVariant::fromValue<QPointF>(newOrigin));
}